

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          *handler)

{
  null_terminating_iterator<char> nVar1;
  internal iVar2;
  uint id;
  internal *piVar3;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *eh;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pfVar4;
  basic_string_view<char> name;
  null_terminating_iterator<char> local_48;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_38;
  type local_28;
  
  eh = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
        *)it.end_;
  local_48.end_ = it.ptr_;
  if (this == (internal *)local_48.end_) {
    iVar2 = (internal)0x0;
  }
  else {
    iVar2 = *this;
  }
  local_48.ptr_ = (char *)this;
  if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
    pfVar4 = eh->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_38.string,&pfVar4->context);
LAB_0011684f:
    (pfVar4->arg).type_ = local_28;
    (pfVar4->arg).value_.field_0.long_long_value = local_38.long_long_value;
    (pfVar4->arg).value_.field_0.string.size = local_38.string.size;
  }
  else {
    if ((byte)((char)iVar2 - 0x30U) < 10) {
      id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
                     (&local_48,eh);
      if ((local_48.ptr_ != local_48.end_) &&
         (((internal)*local_48.ptr_ == (internal)0x7d ||
          ((local_48.ptr_ != local_48.end_ && ((internal)*local_48.ptr_ == (internal)0x3a)))))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_arg_id(eh->handler,id);
        goto LAB_0011685e;
      }
    }
    else if ((iVar2 == (internal)0x5f) || ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a)) {
      name.size_ = 0;
      piVar3 = this + 1;
      do {
        local_48.ptr_ = (char *)piVar3;
        if (local_48.ptr_ == local_48.end_) {
          iVar2 = (internal)0x0;
        }
        else {
          iVar2 = (internal)*local_48.ptr_;
        }
        name.size_ = name.size_ + 1;
        piVar3 = (internal *)local_48.ptr_ + 1;
      } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
              ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
      if ((long)name.size_ < 0) {
        __assert_fail("(value >= 0) && \"negative value\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/core.h"
                      ,0xd3,
                      "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                     );
      }
      pfVar4 = eh->handler;
      name.data_ = (char *)this;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg((format_arg *)&local_38.string,&pfVar4->context,name);
      goto LAB_0011684f;
    }
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::on_error(eh,"invalid format string");
  }
LAB_0011685e:
  nVar1.end_ = local_48.end_;
  nVar1.ptr_ = local_48.ptr_;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}